

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O1

int weapon_lookup(char *name)

{
  pointer pwVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  pointer pwVar5;
  pointer pwVar6;
  
  pwVar1 = weapon_table.super__Vector_base<weapon_type,_std::allocator<weapon_type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar4 = ((long)weapon_table.super__Vector_base<weapon_type,_std::allocator<weapon_type>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)weapon_table.super__Vector_base<weapon_type,_std::allocator<weapon_type>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 >> 2;
  pwVar5 = weapon_table.super__Vector_base<weapon_type,_std::allocator<weapon_type>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < lVar4) {
    lVar4 = lVar4 + 1;
    pwVar5 = weapon_table.super__Vector_base<weapon_type,_std::allocator<weapon_type>_>._M_impl.
             super__Vector_impl_data._M_start + 2;
    do {
      pwVar6 = pwVar5;
      if ((pwVar6[-2].name != (char *)0x0) && (bVar2 = str_prefix(name,pwVar6[-2].name), !bVar2)) {
        pwVar6 = pwVar6 + -2;
        goto LAB_002a1558;
      }
      if ((pwVar6[-1].name != (char *)0x0) && (bVar2 = str_prefix(name,pwVar6[-1].name), !bVar2)) {
        pwVar6 = pwVar6 + -1;
        goto LAB_002a1558;
      }
      if ((pwVar6->name != (char *)0x0) && (bVar2 = str_prefix(name,pwVar6->name), !bVar2))
      goto LAB_002a1558;
      if ((pwVar6[1].name != (char *)0x0) && (bVar2 = str_prefix(name,pwVar6[1].name), !bVar2)) {
        pwVar6 = pwVar6 + 1;
        goto LAB_002a1558;
      }
      lVar4 = lVar4 + -1;
      pwVar5 = pwVar6 + 4;
    } while (1 < lVar4);
    pwVar5 = pwVar6 + 2;
  }
  lVar4 = ((long)pwVar1 - (long)pwVar5 >> 3) * -0x5555555555555555;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      pwVar6 = pwVar1;
      if ((lVar4 != 3) ||
         ((pwVar5->name != (char *)0x0 &&
          (bVar2 = str_prefix(name,pwVar5->name), pwVar6 = pwVar5, !bVar2)))) goto LAB_002a1558;
      pwVar5 = pwVar5 + 1;
    }
    if ((pwVar5->name != (char *)0x0) &&
       (bVar2 = str_prefix(name,pwVar5->name), pwVar6 = pwVar5, !bVar2)) goto LAB_002a1558;
    pwVar5 = pwVar5 + 1;
  }
  pwVar6 = pwVar1;
  if ((pwVar5->name != (char *)0x0) &&
     (bVar2 = str_prefix(name,pwVar5->name), pwVar6 = pwVar5, bVar2)) {
    pwVar6 = pwVar1;
  }
LAB_002a1558:
  if (pwVar6 == weapon_table.super__Vector_base<weapon_type,_std::allocator<weapon_type>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    iVar3 = -1;
  }
  else {
    iVar3 = (int)((ulong)((long)pwVar6 -
                         (long)weapon_table.
                               super__Vector_base<weapon_type,_std::allocator<weapon_type>_>._M_impl
                               .super__Vector_impl_data._M_start) >> 3) * -0x55555555;
  }
  return iVar3;
}

Assistant:

int weapon_lookup(const char *name)
{
	auto it = std::find_if(weapon_table.begin(), weapon_table.end(), [name] (auto weapon) {
		return weapon.name != nullptr && !str_prefix(name, weapon.name);
	});

	return it != weapon_table.end()
		? it - weapon_table.begin()
		: -1;
}